

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

XformEvaluator * __thiscall
tinyusdz::anon_unknown_4::XformEvaluator::RotateZ(XformEvaluator *this,double angle)

{
  double dVar1;
  bool bVar2;
  matrix4d *in_RCX;
  long lVar3;
  matrix4d *pmVar4;
  matrix4d *pmVar5;
  byte bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double x;
  double dVar10;
  double dVar11;
  double dVar12;
  matrix4d rm;
  matrix4d ret;
  matrix4d local_120;
  matrix4d local_a0;
  
  bVar6 = 0;
  local_120.m[0][0] = 1.0;
  local_120.m[0][1] = 0.0;
  local_120.m[0][2] = 0.0;
  local_120.m[0][3] = 0.0;
  local_120.m[1][0] = 0.0;
  local_120.m[1][1] = 1.0;
  local_120.m[1][2] = 0.0;
  local_120.m[1][3] = 0.0;
  local_120.m[2][0] = 0.0;
  local_120.m[2][1] = 0.0;
  local_120.m[2][2] = 1.0;
  local_120.m[2][3] = 0.0;
  local_120.m[3][0] = 0.0;
  local_120.m[3][1] = 0.0;
  local_120.m[3][2] = 0.0;
  local_120.m[3][3] = 1.0;
  x = angle / 180.0;
  if (0.25 <= ABS(x)) {
    dVar11 = -x;
    if (-x <= x) {
      dVar11 = x;
    }
    dVar1 = floor(dVar11);
    dVar11 = dVar11 - dVar1;
    bVar2 = 0.5 < dVar11;
    if (0.5 < dVar11) {
      dVar11 = 1.0 - dVar11;
    }
    dVar9 = dVar11 + -0.5;
    dVar12 = 0.0;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar10 = ABS(dVar11);
      if (dVar10 <= 0.5) {
        dVar10 = 0.5;
      }
      if (dVar10 * 0.0 < ABS(dVar9)) {
        if (dVar11 <= 0.25) {
          dVar11 = cos(dVar11 * 3.141592653589793);
          uVar7 = SUB84(dVar11,0);
          uVar8 = (undefined4)((ulong)dVar11 >> 0x20);
        }
        else {
          dVar11 = sin((0.5 - dVar11) * 3.141592653589793);
          uVar7 = SUB84(dVar11,0);
          uVar8 = (undefined4)((ulong)dVar11 >> 0x20);
        }
        dVar12 = (double)CONCAT44(uVar8,uVar7);
        if (((bVar2 ^ (byte)(int)dVar1) & 1) != 0) {
          dVar12 = -dVar12;
        }
      }
    }
  }
  else {
    dVar12 = cos(x * 3.141592653589793);
  }
  local_120.m[0][1] = math::sin_pi_imp<double>(x);
  local_120.m[1][0] = -local_120.m[0][1];
  local_120.m[0][0] = dVar12;
  local_120.m[1][1] = dVar12;
  tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
            (&local_a0,(value *)&this->m,&local_120,in_RCX);
  pmVar4 = &local_a0;
  pmVar5 = &this->m;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->m[0][0] = pmVar4->m[0][0];
    pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pmVar5 = (matrix4d *)((long)pmVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  return this;
}

Assistant:

XformEvaluator &RotateZ(const double angle) {  // in degrees

    //double rad = math::radian(angle);

    value::matrix4d rm = value::matrix4d::identity();

    double k = angle / 180.0;
    double c = math::cos_pi(k);
    double s = math::sin_pi(k);

    rm.m[0][0] = c;
    rm.m[0][1] = s;
    rm.m[1][0] = -s;
    rm.m[1][1] = c;

    m = m * rm;

    return (*this);
  }